

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkQueue.c
# Opt level: O2

_Bool enque(chunk *chunk,queue *q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = q->capacity;
  uVar2 = q->size;
  if (chunk != (chunk *)0x0 && uVar2 != uVar1) {
    q->size = uVar2 + 1;
    uVar3 = (q->tail + 1U) % uVar1;
    q->tail = uVar3;
    q->elements[uVar3] = chunk;
  }
  return chunk != (chunk *)0x0 && uVar2 != uVar1;
}

Assistant:

bool enque(chunk* chunk, queue* q)
{
    if (q->size == q->capacity || chunk == NULL) { return false; }
    else
    {
        q->size++;
        q->tail = (++q->tail) % q->capacity;
        q->elements[q->tail] = chunk;
    }

    return true;
}